

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

int Abc_NtkDarSeqSim(Abc_Ntk_t *pNtk,int nFrames,int nWords,int TimeOut,int fNew,int fMiter,
                    int fVerbose,char *pFileSim)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Aig_Man_t *pAig;
  Gia_Man_t *pAig_00;
  Fra_Sml_t *p;
  Abc_Cex_t *pAVar4;
  char *pcVar5;
  long lVar6;
  int level;
  Abc_Ntk_t *pAVar7;
  Gia_Man_t *pGVar8;
  Aig_Man_t *pAVar9;
  char *pcVar10;
  long local_58;
  timespec ts;
  
  iVar1 = clock_gettime(3,(timespec *)&ts);
  if (iVar1 < 0) {
    local_58 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                   SEXT816(CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec)),8);
    local_58 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) +
               CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * -1000000;
  }
  iVar1 = Abc_NtkGetChoiceNum(pNtk);
  if (iVar1 != 0) {
    pAVar7 = pNtk;
    uVar2 = Abc_NtkGetChoiceNum(pNtk);
    Abc_Print((int)pAVar7,"Removing %d choices from the AIG.\n",(ulong)uVar2);
    Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
  }
  pAig = Abc_NtkToDar(pNtk,0,1);
  if (fNew == 0) {
    if (pFileSim == (char *)0x0) {
      if (pNtk->nObjCounts[8] == 0) {
        pAVar9 = pAig;
        p = Fra_SmlSimulateComb(pAig,nWords,fMiter);
        iVar1 = (int)pAVar9;
      }
      else {
        pAVar9 = pAig;
        p = Fra_SmlSimulateSeq(pAig,0,nFrames,nWords,fMiter);
        iVar1 = (int)pAVar9;
      }
    }
    else {
      if (pNtk->nObjCounts[8] != 0) {
        __assert_fail("Abc_NtkLatchNum(pNtk) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDar.c"
                      ,0xdeb,
                      "int Abc_NtkDarSeqSim(Abc_Ntk_t *, int, int, int, int, int, int, char *)");
      }
      pAVar9 = pAig;
      p = Fra_SmlSimulateCombGiven(pAig,pFileSim,fMiter,fVerbose);
      iVar1 = (int)pAVar9;
    }
    if (p->fNonConstOut == 0) {
      Abc_Print(iVar1,"Simulation of %d frames with %d words did not assert the outputs.    ",
                (ulong)(uint)nFrames,(ulong)(uint)nWords);
      iVar1 = -1;
    }
    else {
      pAVar4 = Fra_SmlGetCounterExample(p);
      if (pAVar4 != (Abc_Cex_t *)0x0) {
        pcVar10 = "s";
        pcVar5 = "s";
        if (p->nFrames == 1) {
          pcVar5 = "";
        }
        if (p->nWordsFrame == 1) {
          pcVar10 = "";
        }
        Abc_Print(pAVar4->iPo,
                  "Simulation of %d frame%s with %d word%s asserted output %d in frame %d. ",
                  (ulong)(uint)p->nFrames,pcVar5,(ulong)(uint)p->nWordsFrame,pcVar10,
                  (ulong)(uint)pAVar4->iPo,(ulong)(uint)pAVar4->iFrame);
        pAVar9 = pAig;
        iVar1 = Saig_ManVerifyCex(pAig,pAVar4);
        if (iVar1 == 0) {
          Abc_Print((int)pAVar9,"Abc_NtkDarSeqSim(): Counter-example verification has FAILED.\n");
        }
      }
      if (pNtk->pModel != (int *)0x0) {
        free(pNtk->pModel);
        pNtk->pModel = (int *)0x0;
      }
      if (pNtk->pSeqModel != (Abc_Cex_t *)0x0) {
        free(pNtk->pSeqModel);
      }
      pNtk->pSeqModel = pAVar4;
      iVar1 = 0;
    }
    Fra_SmlStop(p);
    iVar3 = (int)p;
  }
  else {
    Gia_ManSimSetDefaultParams((Gia_ParSim_t *)&ts);
    ts.tv_sec._0_4_ = nWords;
    ts.tv_sec._4_4_ = nFrames;
    ts.tv_nsec._4_4_ = TimeOut;
    pAig_00 = Gia_ManFromAig(pAig);
    pGVar8 = pAig_00;
    iVar1 = Gia_ManSimSimulate(pAig_00,(Gia_ParSim_t *)&ts);
    if (iVar1 == 0) {
      Abc_Print((int)pGVar8,"Simulation of %d frames with %d words did not assert the outputs.    ",
                (ulong)(uint)nFrames,(ulong)(uint)nWords);
      iVar1 = -1;
    }
    else {
      pAVar4 = pAig_00->pCexSeq;
      if (pAVar4 != (Abc_Cex_t *)0x0) {
        Abc_Print((int)pGVar8,
                  "Simulation of %d frames with %d words asserted output %d in frame %d. ",
                  (ulong)(uint)nFrames,(ulong)(uint)nWords,(ulong)(uint)pAVar4->iPo,
                  (ulong)(uint)pAVar4->iFrame);
        pAVar9 = pAig;
        iVar1 = Saig_ManVerifyCex(pAig,pAig_00->pCexSeq);
        if (iVar1 == 0) {
          Abc_Print((int)pAVar9,"Abc_NtkDarSeqSim(): Counter-example verification has FAILED.\n");
        }
      }
      if (pNtk->pModel != (int *)0x0) {
        free(pNtk->pModel);
        pNtk->pModel = (int *)0x0;
      }
      if (pNtk->pSeqModel != (Abc_Cex_t *)0x0) {
        free(pNtk->pSeqModel);
      }
      pNtk->pSeqModel = pAig_00->pCexSeq;
      pAig_00->pCexSeq = (Abc_Cex_t *)0x0;
      iVar1 = 0;
    }
    Gia_ManStop(pAig_00);
    iVar3 = (int)pAig_00;
  }
  Abc_Print(iVar3,"%s =","Time");
  level = 3;
  iVar3 = clock_gettime(3,(timespec *)&ts);
  if (iVar3 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec) / 1000 +
            CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) * 1000000;
  }
  Abc_Print(level,"%9.2f sec\n",(double)(lVar6 + local_58) / 1000000.0);
  Aig_ManStop(pAig);
  return iVar1;
}

Assistant:

int Abc_NtkDarSeqSim( Abc_Ntk_t * pNtk, int nFrames, int nWords, int TimeOut, int fNew, int fMiter, int fVerbose, char * pFileSim )
{
    Aig_Man_t * pMan;
    Abc_Cex_t * pCex;
    int status, RetValue = -1;
    abctime clk = Abc_Clock();
    if ( Abc_NtkGetChoiceNum(pNtk) )
    {
        Abc_Print( 1, "Removing %d choices from the AIG.\n", Abc_NtkGetChoiceNum(pNtk) );
        Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
    }
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( fNew )
    {
        Gia_Man_t * pGia;
        Gia_ParSim_t Pars, * pPars = &Pars;
        Gia_ManSimSetDefaultParams( pPars );
        pPars->nWords = nWords;
        pPars->nIters = nFrames;
        pPars->TimeLimit = TimeOut;
        pPars->fCheckMiter = fMiter;
        pPars->fVerbose = fVerbose;
        pGia = Gia_ManFromAig( pMan );
        if ( Gia_ManSimSimulate( pGia, pPars ) )
        { 
            if ( pGia->pCexSeq )
            {
                Abc_Print( 1, "Simulation of %d frames with %d words asserted output %d in frame %d. ", 
                    nFrames, nWords, pGia->pCexSeq->iPo, pGia->pCexSeq->iFrame );
                status = Saig_ManVerifyCex( pMan, pGia->pCexSeq );
                if ( status == 0 )
                    Abc_Print( 1, "Abc_NtkDarSeqSim(): Counter-example verification has FAILED.\n" );
            }
            ABC_FREE( pNtk->pModel );
            ABC_FREE( pNtk->pSeqModel );
            pNtk->pSeqModel = pGia->pCexSeq; pGia->pCexSeq = NULL;
            RetValue = 0;
        }
        else
        {
            Abc_Print( 1, "Simulation of %d frames with %d words did not assert the outputs.    ", 
                nFrames, nWords );
        }
        Gia_ManStop( pGia );
    }
    else // comb/seq simulator
    {
        Fra_Sml_t * pSml;
        if ( pFileSim != NULL )
        {
            assert( Abc_NtkLatchNum(pNtk) == 0 );
            pSml = Fra_SmlSimulateCombGiven( pMan, pFileSim, fMiter, fVerbose );
        }
        else if ( Abc_NtkLatchNum(pNtk) == 0 )
            pSml = Fra_SmlSimulateComb( pMan, nWords, fMiter );
        else
            pSml = Fra_SmlSimulateSeq( pMan, 0, nFrames, nWords, fMiter );
        if ( pSml->fNonConstOut )
        {
            pCex = Fra_SmlGetCounterExample( pSml );
            if ( pCex )
            {
                Abc_Print( 1, "Simulation of %d frame%s with %d word%s asserted output %d in frame %d. ", 
                    pSml->nFrames, pSml->nFrames == 1 ? "": "s", 
                    pSml->nWordsFrame, pSml->nWordsFrame == 1 ? "": "s", 
                    pCex->iPo, pCex->iFrame );
                status = Saig_ManVerifyCex( pMan, pCex );
                if ( status == 0 )
                    Abc_Print( 1, "Abc_NtkDarSeqSim(): Counter-example verification has FAILED.\n" );
            }
            ABC_FREE( pNtk->pModel );
            ABC_FREE( pNtk->pSeqModel );
            pNtk->pSeqModel = pCex;
            RetValue = 0;
        }
        else
        {
            Abc_Print( 1, "Simulation of %d frames with %d words did not assert the outputs.    ", 
                nFrames, nWords );
        }
        Fra_SmlStop( pSml );
    }
    ABC_PRT( "Time", Abc_Clock() - clk );
    Aig_ManStop( pMan );
    return RetValue;
}